

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_print_exception_op(sexp ctx,sexp self,sexp_sint_t n,sexp exn,sexp out)

{
  char *pcVar1;
  sexp psVar2;
  sexp psVar3;
  ulong uVar4;
  size_t sVar5;
  sexp_sint_t extraout_RDX;
  sexp_sint_t extraout_RDX_00;
  sexp_sint_t extraout_RDX_01;
  sexp_sint_t extraout_RDX_02;
  sexp_sint_t extraout_RDX_03;
  sexp_sint_t extraout_RDX_04;
  sexp_sint_t extraout_RDX_05;
  sexp_sint_t extraout_RDX_06;
  sexp_sint_t extraout_RDX_07;
  sexp_sint_t extraout_RDX_08;
  sexp_sint_t extraout_RDX_09;
  sexp_sint_t sVar6;
  sexp_sint_t extraout_RDX_10;
  sexp_sint_t extraout_RDX_11;
  sexp_sint_t extraout_RDX_12;
  char **ppcVar7;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_58;
  sexp local_50;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  ppcVar7 = (char **)&local_58;
  local_58 = (sexp)&DAT_0000043e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  local_50 = (sexp)&DAT_0000043e;
  local_38.var = (sexp_conflict *)0x0;
  local_38.next = (sexp_gc_var_t *)0x0;
  if ((((ulong)exn & 3) == 0) && (exn->tag == 0x13)) {
    psVar2 = (exn->value).type.name;
    if ((psVar2 == (sexp)(((ctx->value).type.setters)->value).context.mark_stack[4].end) &&
       (psVar3 = (exn->value).type.slots, ((ulong)psVar3 & 3) == 0)) {
      if ((psVar2 == (sexp)0xa3e) || (psVar3->tag == 0x13)) {
LAB_0010d6b2:
        sexp_print_exception_op(ctx,self,n,(exn->value).type.slots,out);
        goto LAB_0010d633;
      }
    }
    else if (psVar2 == (sexp)0xa3e) goto LAB_0010d6b2;
  }
  local_38.next = &local_48;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_38.next;
  local_38.var = &local_50;
  (ctx->value).context.saves = &local_38;
  if (((((ulong)out & 3) != 0) || (local_48.var = &local_58, out->tag != 0x11)) &&
     ((local_48.var = &local_58, out = sexp_make_input_port(ctx,_stderr,(sexp)&DAT_0000003e),
      local_50 = out, ((ulong)out & 3) != 0 || (out->tag != 0x13)))) {
    out->tag = 0x11;
  }
  if ((out->value).type.setters == (sexp)0x0) {
    fputs("ERROR",(FILE *)(out->value).type.getters);
  }
  else {
    sexp_buffered_write_string_n(ctx,"ERROR",5,out);
  }
  if ((((ulong)exn & 3) == 0) && (exn->tag == 0x13)) {
    psVar2 = (exn->value).type.getters;
    if ((psVar2 != (sexp)0x0) && (((ulong)psVar2 & 3) == 0)) {
      if (psVar2->tag == 0x14) {
        local_58 = (sexp)(((psVar2->value).type.name)->value).stack.length;
        if ((local_58 != (sexp)0x0) &&
           ((((uint)local_58 & 0xf) == 6 || ((((ulong)local_58 & 3) == 0 && (local_58->tag == 7)))))
           ) {
          if ((out->value).type.setters == (sexp)0x0) {
            fputs(" in ",(FILE *)(out->value).type.getters);
            sVar6 = extraout_RDX_11;
          }
          else {
            sexp_buffered_write_string_n(ctx," in ",4,out);
            sVar6 = extraout_RDX_02;
            ppcVar7 = (char **)&local_58;
          }
LAB_0010da10:
          sexp_write_op(ctx,(sexp)0x0,sVar6,(sexp)*ppcVar7,out);
        }
      }
      else if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0x1b)) {
        if ((out->value).type.setters == (sexp)0x0) {
          fputs(" in ",(FILE *)(out->value).type.getters);
          sVar6 = extraout_RDX_12;
        }
        else {
          sexp_buffered_write_string_n(ctx," in ",4,out);
          sVar6 = extraout_RDX_03;
        }
        ppcVar7 = &((exn->value).port.stream)->_IO_read_ptr;
        goto LAB_0010da10;
      }
    }
    local_58 = (exn->value).type.setters;
    if ((((((ulong)local_58 & 3) != 0 || local_58 == (sexp)0x0) || (local_58->tag != 6)) &&
        (psVar2 = (exn->value).type.getters, ((ulong)psVar2 & 3) == 0 && psVar2 != (sexp)0x0)) &&
       (psVar2->tag == 0x14)) {
      local_58 = (((psVar2->value).type.name)->value).type.slots;
    }
    if ((((ulong)local_58 & 3) == 0 && local_58 != (sexp)0x0) && (local_58->tag == 6)) {
      uVar4 = (local_58->value).string.offset;
      if (uVar4 != 0 && (uVar4 & 1) != 0) {
        if ((out->value).type.setters == (sexp)0x0) {
          fputs(" on line ",(FILE *)(out->value).type.getters);
          sVar6 = extraout_RDX_04;
        }
        else {
          sexp_buffered_write_string_n(ctx," on line ",9,out);
          sVar6 = extraout_RDX;
        }
        sexp_write_op(ctx,(sexp)0x0,sVar6,(local_58->value).type.cpl,out);
      }
      psVar2 = (local_58->value).type.name;
      if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 9)) {
        if ((out->value).type.setters == (sexp)0x0) {
          fputs(" of file ",(FILE *)(out->value).type.getters);
        }
        else {
          sexp_buffered_write_string_n(ctx," of file ",9,out);
        }
        psVar2 = (local_58->value).type.name;
        pcVar1 = (((psVar2->value).type.name)->value).flonum_bits + 8 +
                 (long)(psVar2->value).type.cpl;
        if ((out->value).type.setters == (sexp)0x0) {
          fputs(pcVar1,(FILE *)(out->value).type.getters);
        }
        else {
          sVar5 = strlen(pcVar1);
          sexp_buffered_write_string_n(ctx,pcVar1,sVar5,out);
        }
      }
    }
    if ((out->value).type.setters == (sexp)0x0) {
      fputs(": ",(FILE *)(out->value).type.getters);
      sVar6 = extraout_RDX_06;
    }
    else {
      sexp_buffered_write_string_n(ctx,": ",2,out);
      sVar6 = extraout_RDX_05;
    }
    psVar2 = (exn->value).type.cpl;
    if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 9)) {
      pcVar1 = (((psVar2->value).type.name)->value).flonum_bits + 8 + (long)(psVar2->value).type.cpl
      ;
      if ((out->value).type.setters == (sexp)0x0) {
        fputs(pcVar1,(FILE *)(out->value).type.getters);
      }
      else {
        sVar5 = strlen(pcVar1);
        sexp_buffered_write_string_n(ctx,pcVar1,sVar5,out);
      }
    }
    else {
      sexp_write_op(ctx,(sexp)0x0,sVar6,psVar2,out);
    }
    psVar2 = (exn->value).type.slots;
    if ((((ulong)psVar2 & 3) != 0 || psVar2 == (sexp)0x0) || (psVar2->tag != 6)) goto LAB_0010d5e6;
    psVar3 = (out->value).type.setters;
    if ((psVar2->value).type.cpl == (sexp)0x23e) {
      if (psVar3 == (sexp)0x0) {
        fputs(": ",(FILE *)(out->value).type.getters);
        sVar6 = extraout_RDX_10;
      }
      else {
        sexp_buffered_write_string_n(ctx,": ",2,out);
        sVar6 = extraout_RDX_07;
      }
      sexp_write_op(ctx,(sexp)0x0,sVar6,(((exn->value).type.slots)->value).type.name,out);
      if ((out->value).type.setters == (sexp)0x0) {
        fputs("\n",(FILE *)(out->value).type.getters);
      }
      else {
        sexp_buffered_write_string_n(ctx,"\n",1,out);
      }
    }
    else {
      if (psVar3 == (sexp)0x0) {
        fputs("\n",(FILE *)(out->value).type.getters);
      }
      else {
        sexp_buffered_write_string_n(ctx,"\n",1,out);
      }
      for (local_58 = (exn->value).type.slots; (((ulong)local_58 & 3) == 0 && (local_58->tag == 6));
          local_58 = (local_58->value).type.cpl) {
        if ((out->value).type.setters == (sexp)0x0) {
          fputs("    ",(FILE *)(out->value).type.getters);
          sVar6 = extraout_RDX_09;
        }
        else {
          sexp_buffered_write_string_n(ctx,"    ",4,out);
          sVar6 = extraout_RDX_08;
        }
        sexp_write_op(ctx,(sexp)0x0,sVar6,(local_58->value).type.name,out);
        psVar2 = (out->value).type.setters;
        if (psVar2 == (sexp)0x0) {
          putc(10,(FILE *)(out->value).type.getters);
        }
        else {
          psVar3 = (out->value).type.print;
          if (psVar3 < (sexp)(out->value).port.size) {
            (out->value).type.print = (sexp)((long)&psVar3->tag + 1);
            *(undefined1 *)((long)&psVar3->tag + (long)&psVar2->tag) = 10;
          }
          else {
            sexp_buffered_write_char(ctx,10,out);
          }
        }
      }
    }
  }
  else {
    if ((out->value).type.setters == (sexp)0x0) {
      fputs(": ",(FILE *)(out->value).type.getters);
      sVar6 = extraout_RDX_01;
    }
    else {
      sexp_buffered_write_string_n(ctx,": ",2,out);
      sVar6 = extraout_RDX_00;
    }
    if ((((ulong)exn & 3) == 0) && (exn->tag == 9)) {
      pcVar1 = (((exn->value).type.name)->value).flonum_bits + 8 + (long)(exn->value).type.cpl;
      if ((out->value).type.setters == (sexp)0x0) {
        fputs(pcVar1,(FILE *)(out->value).type.getters);
      }
      else {
        sVar5 = strlen(pcVar1);
        sexp_buffered_write_string_n(ctx,pcVar1,sVar5,out);
      }
    }
    else {
      sexp_write_op(ctx,(sexp)0x0,sVar6,exn,out);
    }
LAB_0010d5e6:
    psVar2 = (out->value).type.setters;
    if (psVar2 == (sexp)0x0) {
      putc(10,(FILE *)(out->value).type.getters);
    }
    else {
      psVar3 = (out->value).type.print;
      if (psVar3 < (sexp)(out->value).port.size) {
        (out->value).type.print = (sexp)((long)&psVar3->tag + 1);
        *(undefined1 *)((long)&psVar3->tag + (long)&psVar2->tag) = 10;
      }
      else {
        sexp_buffered_write_char(ctx,10,out);
      }
    }
  }
  (ctx->value).context.saves = local_48.next;
LAB_0010d633:
  return (sexp)&DAT_0000043e;
}

Assistant:

sexp sexp_print_exception_op (sexp ctx, sexp self, sexp_sint_t n, sexp exn, sexp out) {
  sexp_gc_var2(ls, tmp);
  /* unwrap continuable exceptions */
  if (sexp_exceptionp(exn)
      && ((sexp_exception_kind(exn) == sexp_global(ctx, SEXP_G_CONTINUABLE_SYMBOL)
           && sexp_exceptionp(sexp_exception_irritants(exn)))
          || sexp_exception_kind(exn) == SEXP_UNCAUGHT)) {
    return sexp_print_exception_op(ctx, self, n, sexp_exception_irritants(exn), out);
  }
  sexp_gc_preserve2(ctx, ls, tmp);
  if (! sexp_oportp(out))
    out = tmp = sexp_make_output_port(ctx, stderr, SEXP_FALSE);
  sexp_write_string(ctx, "ERROR", out);
  if (sexp_exceptionp(exn)) {
    if (sexp_exception_procedure(exn)) {
      if (sexp_procedurep(sexp_exception_procedure(exn))) {
        ls = sexp_bytecode_name(
              sexp_procedure_code(sexp_exception_procedure(exn)));
        if (ls && sexp_symbolp(ls)) {
          sexp_write_string(ctx, " in ", out);
          sexp_write(ctx, ls, out);
        }
      } else if (sexp_opcodep(sexp_exception_procedure(exn))) {
        sexp_write_string(ctx, " in ", out);
        sexp_write(ctx, sexp_opcode_name(sexp_exception_procedure(exn)), out);
      }
    }
    ls = sexp_exception_source(exn);
    if ((! (ls && sexp_pairp(ls)))
        && sexp_exception_procedure(exn)
        && sexp_procedurep(sexp_exception_procedure(exn)))
      ls = sexp_bytecode_source(sexp_procedure_code(sexp_exception_procedure(exn)));
    if (ls && sexp_pairp(ls)) {
      if (sexp_fixnump(sexp_cdr(ls)) && (sexp_cdr(ls) >= SEXP_ZERO)) {
        sexp_write_string(ctx, " on line ", out);
        sexp_write(ctx, sexp_cdr(ls), out);
      }
      if (sexp_stringp(sexp_car(ls))) {
        sexp_write_string(ctx, " of file ", out);
        sexp_write_string(ctx, sexp_string_data(sexp_car(ls)), out);
      }
    }
    sexp_write_string(ctx, ": ", out);
    if (sexp_stringp(sexp_exception_message(exn)))
      sexp_write_string(ctx, sexp_string_data(sexp_exception_message(exn)), out);
    else
      sexp_write(ctx, sexp_exception_message(exn), out);
    if (sexp_exception_irritants(exn)
        && sexp_pairp(sexp_exception_irritants(exn))) {
      if (sexp_nullp(sexp_cdr(sexp_exception_irritants(exn)))) {
        sexp_write_string(ctx, ": ", out);
        sexp_write(ctx, sexp_car(sexp_exception_irritants(exn)), out);
        sexp_write_string(ctx, "\n", out);
      } else {
        sexp_write_string(ctx, "\n", out);
        for (ls=sexp_exception_irritants(exn);
             sexp_pairp(ls); ls=sexp_cdr(ls)) {
          sexp_write_string(ctx, "    ", out);
          sexp_write(ctx, sexp_car(ls), out);
          sexp_write_char(ctx, '\n', out);
        }
      }
    } else {
      sexp_write_char(ctx, '\n', out);
    }
  } else {
    sexp_write_string(ctx, ": ", out);
    if (sexp_stringp(exn))
      sexp_write_string(ctx, sexp_string_data(exn), out);
    else
      sexp_write(ctx, exn, out);
    sexp_write_char(ctx, '\n', out);
  }
  sexp_gc_release2(ctx);
  return SEXP_VOID;
}